

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caniter.cpp
# Opt level: O3

void __thiscall
icu_63::CanonicalIterator::setSource
          (CanonicalIterator *this,UnicodeString *newSource,UErrorCode *status)

{
  size_t s;
  short sVar1;
  UBool UVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined8 *puVar6;
  UMemory *pUVar7;
  long lVar8;
  UnicodeString **ppUVar9;
  int32_t *piVar10;
  UnicodeString *pUVar11;
  int32_t iVar12;
  int32_t offset;
  UnicodeString *p;
  int iVar13;
  UnicodeString *pUVar14;
  long lVar15;
  
  pUVar11 = &this->source;
  pUVar14 = newSource;
  (*(this->nfd->super_UObject)._vptr_UObject[3])(this->nfd,newSource,pUVar11);
  if (U_ZERO_ERROR < *status) {
    return;
  }
  this->done = '\0';
  cleanPieces(this);
  sVar1 = (newSource->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (newSource->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  if (iVar3 == 0) {
    ppUVar9 = (UnicodeString **)uprv_malloc_63(8);
    this->pieces = ppUVar9;
    piVar10 = (int32_t *)uprv_malloc_63(4);
    this->pieces_lengths = piVar10;
    this->pieces_length = 1;
    piVar10 = (int32_t *)uprv_malloc_63(4);
    this->current = piVar10;
    this->current_length = 1;
    if (((piVar10 != (int32_t *)0x0) && (this->pieces != (UnicodeString **)0x0)) &&
       (this->pieces_lengths != (int32_t *)0x0)) {
      *piVar10 = 0;
      puVar6 = (undefined8 *)UMemory::operator_new__((UMemory *)0x48,(size_t)pUVar14);
      if (puVar6 == (undefined8 *)0x0) {
        pUVar11 = (UnicodeString *)0x0;
      }
      else {
        *puVar6 = 1;
        pUVar11 = (UnicodeString *)(puVar6 + 1);
        puVar6[1] = &PTR__UnicodeString_003f5be0;
        *(undefined2 *)(puVar6 + 2) = 2;
      }
      *this->pieces = pUVar11;
      *this->pieces_lengths = 1;
      if (*this->pieces != (UnicodeString *)0x0) {
        return;
      }
    }
  }
  else {
    sVar1 = (this->source).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (this->source).fUnion.fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    lVar15 = (long)iVar3 * 0x40;
    pUVar7 = (UMemory *)0xffffffffffffffff;
    if (-1 < iVar3) {
      pUVar7 = (UMemory *)(lVar15 + 8);
    }
    pUVar7 = (UMemory *)UMemory::operator_new__(pUVar7,(size_t)pUVar14);
    if (pUVar7 != (UMemory *)0x0) {
      *(long *)pUVar7 = (long)iVar3;
      if (iVar3 != 0) {
        lVar8 = 0;
        do {
          *(undefined ***)(pUVar7 + lVar8 + 8) = &PTR__UnicodeString_003f5be0;
          *(undefined2 *)(pUVar7 + lVar8 + 0x10) = 2;
          lVar8 = lVar8 + 0x40;
        } while (lVar15 != lVar8);
      }
      iVar3 = 0;
      uVar4 = UnicodeString::char32At(pUVar11,0);
      offset = 2 - (uint)(uVar4 < 0x10000);
      sVar1 = (this->source).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar5 = (this->source).fUnion.fFields.fLength;
      }
      else {
        iVar5 = (int)sVar1 >> 5;
      }
      pUVar14 = (UnicodeString *)(pUVar7 + 8);
      iVar13 = 0;
      if (offset < iVar5) {
        iVar3 = 0;
        do {
          uVar4 = UnicodeString::char32At(pUVar11,offset);
          UVar2 = Normalizer2Impl::isCanonSegmentStarter(this->nfcImpl,uVar4);
          if (UVar2 != '\0') {
            lVar15 = (long)iVar13;
            lVar8 = lVar15 * 0x40;
            if (*(short *)(pUVar7 + lVar8 + 0x10) < 0) {
              iVar12 = *(int32_t *)(pUVar7 + lVar8 + 0x14);
            }
            else {
              iVar12 = (int)*(short *)(pUVar7 + lVar8 + 0x10) >> 5;
            }
            iVar13 = iVar13 + 1;
            UnicodeString::doReplace(pUVar14 + lVar15,0,iVar12,pUVar11,iVar3,offset - iVar3);
            iVar3 = offset;
          }
          sVar1 = (this->source).fUnion.fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar5 = (this->source).fUnion.fFields.fLength;
          }
          else {
            iVar5 = (int)sVar1 >> 5;
          }
          offset = (offset - (uint)(uVar4 < 0x10000)) + 2;
        } while (offset < iVar5);
      }
      uVar4 = iVar13 + 1;
      lVar15 = (long)iVar13;
      if (*(short *)(pUVar7 + lVar15 * 0x40 + 0x10) < 0) {
        iVar12 = *(int32_t *)(pUVar7 + lVar15 * 0x40 + 0x14);
      }
      else {
        iVar12 = (int)*(short *)(pUVar7 + lVar15 * 0x40 + 0x10) >> 5;
      }
      p = (UnicodeString *)0x0;
      UnicodeString::doReplace(pUVar14 + lVar15,0,iVar12,pUVar11,iVar3,offset - iVar3);
      ppUVar9 = (UnicodeString **)uprv_malloc_63(lVar15 * 8 + 8);
      this->pieces = ppUVar9;
      this->pieces_length = uVar4;
      s = lVar15 * 4 + 4;
      piVar10 = (int32_t *)uprv_malloc_63(s);
      this->pieces_lengths = piVar10;
      piVar10 = (int32_t *)uprv_malloc_63(s);
      this->current = piVar10;
      this->current_length = uVar4;
      if (((this->pieces != (UnicodeString **)0x0) && (this->pieces_lengths != (int32_t *)0x0)) &&
         (piVar10 != (int32_t *)0x0)) {
        if (-1 < iVar13) {
          p = (UnicodeString *)0x0;
          memset(piVar10,0,(ulong)uVar4 << 2);
        }
        if (0 < this->pieces_length) {
          lVar15 = 0;
          lVar8 = 0;
          do {
            p = pUVar14;
            pUVar11 = getEquivalents(this,pUVar14,(int32_t *)((long)this->pieces_lengths + lVar15),
                                     status);
            *(UnicodeString **)((long)this->pieces + lVar15 * 2) = pUVar11;
            lVar8 = lVar8 + 1;
            lVar15 = lVar15 + 4;
            pUVar14 = pUVar14 + 1;
          } while (lVar8 < this->pieces_length);
        }
        if (*(long *)pUVar7 != 0) {
          lVar15 = *(long *)pUVar7 << 6;
          do {
            UnicodeString::~UnicodeString((UnicodeString *)(pUVar7 + lVar15 + -0x38));
            lVar15 = lVar15 + -0x40;
          } while (lVar15 != 0);
        }
        UMemory::operator_delete__(pUVar7,p);
        return;
      }
      *status = U_MEMORY_ALLOCATION_ERROR;
      if (*(long *)pUVar7 != 0) {
        lVar15 = *(long *)pUVar7 << 6;
        do {
          UnicodeString::~UnicodeString((UnicodeString *)(pUVar7 + lVar15 + -0x38));
          lVar15 = lVar15 + -0x40;
        } while (lVar15 != 0);
      }
      UMemory::operator_delete__(pUVar7,p);
      goto LAB_0028eece;
    }
  }
  *status = U_MEMORY_ALLOCATION_ERROR;
LAB_0028eece:
  cleanPieces(this);
  return;
}

Assistant:

void CanonicalIterator::setSource(const UnicodeString &newSource, UErrorCode &status) {
    int32_t list_length = 0;
    UChar32 cp = 0;
    int32_t start = 0;
    int32_t i = 0;
    UnicodeString *list = NULL;

    nfd.normalize(newSource, source, status);
    if(U_FAILURE(status)) {
      return;
    }
    done = FALSE;

    cleanPieces();

    // catch degenerate case
    if (newSource.length() == 0) {
        pieces = (UnicodeString **)uprv_malloc(sizeof(UnicodeString *));
        pieces_lengths = (int32_t*)uprv_malloc(1 * sizeof(int32_t));
        pieces_length = 1;
        current = (int32_t*)uprv_malloc(1 * sizeof(int32_t));
        current_length = 1;
        if (pieces == NULL || pieces_lengths == NULL || current == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            goto CleanPartialInitialization;
        }
        current[0] = 0;
        pieces[0] = new UnicodeString[1];
        pieces_lengths[0] = 1;
        if (pieces[0] == 0) {
            status = U_MEMORY_ALLOCATION_ERROR;
            goto CleanPartialInitialization;
        }
        return;
    }


    list = new UnicodeString[source.length()];
    if (list == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        goto CleanPartialInitialization;
    }

    // i should initialy be the number of code units at the 
    // start of the string
    i = U16_LENGTH(source.char32At(0));
    //int32_t i = 1;
    // find the segments
    // This code iterates through the source string and 
    // extracts segments that end up on a codepoint that
    // doesn't start any decompositions. (Analysis is done
    // on the NFD form - see above).
    for (; i < source.length(); i += U16_LENGTH(cp)) {
        cp = source.char32At(i);
        if (nfcImpl.isCanonSegmentStarter(cp)) {
            source.extract(start, i-start, list[list_length++]); // add up to i
            start = i;
        }
    }
    source.extract(start, i-start, list[list_length++]); // add last one


    // allocate the arrays, and find the strings that are CE to each segment
    pieces = (UnicodeString **)uprv_malloc(list_length * sizeof(UnicodeString *));
    pieces_length = list_length;
    pieces_lengths = (int32_t*)uprv_malloc(list_length * sizeof(int32_t));
    current = (int32_t*)uprv_malloc(list_length * sizeof(int32_t));
    current_length = list_length;
    if (pieces == NULL || pieces_lengths == NULL || current == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        goto CleanPartialInitialization;
    }

    for (i = 0; i < current_length; i++) {
        current[i] = 0;
    }
    // for each segment, get all the combinations that can produce 
    // it after NFD normalization
    for (i = 0; i < pieces_length; ++i) {
        //if (PROGRESS) printf("SEGMENT\n");
        pieces[i] = getEquivalents(list[i], pieces_lengths[i], status);
    }

    delete[] list;
    return;
// Common section to cleanup all local variables and reset object variables.
CleanPartialInitialization:
    if (list != NULL) {
        delete[] list;
    }
    cleanPieces();
}